

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

String * __thiscall
capnp::JsonCodec::encodeRaw(String *__return_storage_ptr__,JsonCodec *this,Reader value)

{
  Impl *this_00;
  StringTree local_58;
  bool local_19;
  JsonCodec *pJStack_18;
  bool multiline;
  JsonCodec *this_local;
  
  local_19 = false;
  pJStack_18 = this;
  this_local = (JsonCodec *)__return_storage_ptr__;
  this_00 = kj::Own<capnp::JsonCodec::Impl>::operator->(&this->impl);
  Impl::encodeRaw(&local_58,this_00,value,0,&local_19,false);
  kj::StringTree::flatten(__return_storage_ptr__,&local_58);
  kj::StringTree::~StringTree(&local_58);
  return __return_storage_ptr__;
}

Assistant:

kj::String JsonCodec::encodeRaw(JsonValue::Reader value) const {
  bool multiline = false;
  return impl->encodeRaw(value, 0, multiline, false).flatten();
}